

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BadStateCase::iterate(BadStateCase *this)

{
  ostringstream *this_00;
  CaseType CVar1;
  RenderContext *renderCtx;
  deUint32 dVar2;
  deUint32 err;
  ProgramSources *pPVar3;
  int line;
  ShaderSource *indirect;
  char *description;
  deUint32 cmdBufferID;
  deUint32 indexBufferID;
  deUint16 indices [3];
  deUint32 dataBufferID;
  deUint32 vaoID;
  undefined1 local_478 [8];
  _Alloc_hider _Stack_470;
  undefined4 local_468;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined1 local_410 [8];
  deUint32 local_408;
  GLContext gl;
  ShaderProgram program;
  undefined1 local_1a8 [176];
  pointer local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined8 uStack_e7;
  
  local_448 = 0;
  uStack_440 = 0x3f80000000000000;
  local_438 = 0x3f800000;
  uStack_430 = 0x3f80000000000000;
  local_428 = 0x3f80000000000000;
  uStack_420 = 0x3f80000000000000;
  indices[2] = 1;
  indices[0] = 0;
  indices[1] = 2;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (pointer)0x100000001;
  sglr::GLContext::GLContext
            (&gl,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,1,
             (IVec4 *)local_1a8);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_f8 = (pointer)0x0;
  uStack_f0 = 0;
  uStack_ef = 0;
  uStack_e8 = 0;
  uStack_e7 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vaoID,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)&indexBufferID);
  glu::VertexSource::VertexSource((VertexSource *)local_478,(string *)&vaoID);
  pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_1a8,(ShaderSource *)local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dataBufferID,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&cmdBufferID);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_410,(string *)&dataBufferID);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_410);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar3);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&dataBufferID);
  std::__cxx11::string::~string((string *)&_Stack_470);
  std::__cxx11::string::~string((string *)&vaoID);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1a8);
  vaoID = 0;
  dataBufferID = 0;
  indexBufferID = 0;
  cmdBufferID = 0;
  dVar2 = sglr::GLContext::getAttribLocation(&gl,program.m_program.m_program,"a_position");
  local_478 = (undefined1  [8])0x100000003;
  _Stack_470._M_p = (pointer)0x0;
  local_468 = 0;
  err = sglr::GLContext::getError(&gl);
  glu::checkError(err,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x9ba);
  CVar1 = this->m_caseType;
  if (CVar1 == CASE_DEFAULT_VAO) {
    sglr::GLContext::genBuffers(&gl,1,&dataBufferID);
    sglr::GLContext::bindBuffer(&gl,0x8892,dataBufferID);
    sglr::GLContext::bufferData(&gl,0x8892,0x30,&local_448,0x88e4);
    sglr::GLContext::vertexAttribPointer(&gl,dVar2,4,0x1406,0,0,(void *)0x0);
    sglr::GLContext::enableVertexAttribArray(&gl,dVar2);
    dVar2 = sglr::GLContext::getError(&gl);
    line = 0x9d7;
  }
  else if (CVar1 == CASE_CLIENT_BUFFER_COMMAND) {
    sglr::GLContext::genVertexArrays(&gl,1,&vaoID);
    sglr::GLContext::bindVertexArray(&gl,vaoID);
    sglr::GLContext::genBuffers(&gl,1,&dataBufferID);
    sglr::GLContext::bindBuffer(&gl,0x8892,dataBufferID);
    sglr::GLContext::bufferData(&gl,0x8892,0x30,&local_448,0x88e4);
    sglr::GLContext::vertexAttribPointer(&gl,dVar2,4,0x1406,0,0,(void *)0x0);
    sglr::GLContext::enableVertexAttribArray(&gl,dVar2);
    dVar2 = sglr::GLContext::getError(&gl);
    line = 0x9ce;
  }
  else {
    if (CVar1 != CASE_CLIENT_BUFFER_VERTEXATTR) goto LAB_003e2e25;
    sglr::GLContext::vertexAttribPointer(&gl,dVar2,4,0x1406,0,0,&local_448);
    sglr::GLContext::enableVertexAttribArray(&gl,dVar2);
    dVar2 = sglr::GLContext::getError(&gl);
    line = 0x9c2;
  }
  glu::checkError(dVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,line);
LAB_003e2e25:
  sglr::GLContext::genBuffers(&gl,1,&indexBufferID);
  sglr::GLContext::bindBuffer(&gl,0x8893,indexBufferID);
  sglr::GLContext::bufferData(&gl,0x8893,6,indices,0x88e4);
  dVar2 = sglr::GLContext::getError(&gl);
  glu::checkError(dVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x9df);
  if (this->m_caseType != CASE_CLIENT_BUFFER_COMMAND) {
    sglr::GLContext::genBuffers(&gl,1,&cmdBufferID);
    sglr::GLContext::bindBuffer(&gl,0x8f3f,cmdBufferID);
    sglr::GLContext::bufferData(&gl,0x8f3f,0x14,local_478,0x88e4);
    dVar2 = sglr::GLContext::getError(&gl);
    glu::checkError(dVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x9e6);
  }
  sglr::GLContext::viewport(&gl,0,0,1,1);
  sglr::GLContext::useProgram(&gl,program.m_program.m_program);
  indirect = (ShaderSource *)0x0;
  if (this->m_caseType == CASE_CLIENT_BUFFER_COMMAND) {
    indirect = (ShaderSource *)local_478;
  }
  sglr::GLContext::drawElementsIndirect(&gl,4,0x1403,indirect);
  dVar2 = sglr::GLContext::getError(&gl);
  sglr::GLContext::bindVertexArray(&gl,0);
  sglr::GLContext::useProgram(&gl,0);
  if (dVar2 != 0x502) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Unexpected error. Expected GL_INVALID_OPERATION, got ");
    local_410 = (undefined1  [8])glu::getErrorName;
    local_408 = dVar2;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_410,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    description = "Got unexpected error.";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(dVar2 != 0x502),
             description);
  glu::ShaderProgram::~ShaderProgram(&program);
  sglr::GLContext::~GLContext(&gl);
  return STOP;
}

Assistant:

BadStateCase::IterateResult BadStateCase::iterate (void)
{
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
	};

	const deUint16 indices[] =
	{
		0, 2, 1,
	};

	sglr::GLContext gl(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, 1, 1));

	deUint32			error;
	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_commonVertexShaderSource) << glu::FragmentSource(s_commonFragmentShaderSource));
	deUint32			vaoID			= 0;
	deUint32			dataBufferID	= 0;
	deUint32			indexBufferID	= 0;
	deUint32			cmdBufferID		= 0;

	const deUint32		programID		= program.getProgram();
	const deInt32		posLocation		= gl.getAttribLocation(programID, "a_position");

	DrawElementsCommand drawCommand;
	drawCommand.count				= 3;
	drawCommand.primCount			= 1;
	drawCommand.firstIndex			= 0;
	drawCommand.baseVertex			= 0;
	drawCommand.reservedMustBeZero	= 0;

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	if (m_caseType == CASE_CLIENT_BUFFER_VERTEXATTR)
	{
		// \note We use default VAO since we use client pointers. Trying indirect draw with default VAO is also an error. => This test does two illegal operations

		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, vertexPositions);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else if (m_caseType == CASE_CLIENT_BUFFER_COMMAND)
	{
		gl.genVertexArrays(1, &vaoID);
		gl.bindVertexArray(vaoID);

		gl.genBuffers(1, &dataBufferID);
		gl.bindBuffer(GL_ARRAY_BUFFER, dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else if (m_caseType == CASE_DEFAULT_VAO)
	{
		gl.genBuffers(1, &dataBufferID);
		gl.bindBuffer(GL_ARRAY_BUFFER, dataBufferID);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
		gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.enableVertexAttribArray(posLocation);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}
	else
		DE_ASSERT(DE_FALSE);

	gl.genBuffers(1, &indexBufferID);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBufferID);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	if (m_caseType != CASE_CLIENT_BUFFER_COMMAND)
	{
		gl.genBuffers(1, &cmdBufferID);
		gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, cmdBufferID);
		gl.bufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	}

	gl.viewport(0, 0, 1, 1);

	gl.useProgram(programID);
	gl.drawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, (m_caseType != CASE_CLIENT_BUFFER_COMMAND) ? (DE_NULL) : (&drawCommand));

	error = gl.getError();

	gl.bindVertexArray(0);
	gl.useProgram(0);

	if (error == GL_INVALID_OPERATION)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Unexpected error. Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected error.");
	}

	return STOP;
}